

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O0

void ovf::detail::write::append_data_bin_to_string<double>
               (string *output_to_file,double *vf,int n_cols,int n_rows,int format)

{
  uchar *puVar1;
  reference pvVar2;
  allocator local_179;
  string local_178 [36];
  float local_154;
  float local_150;
  uint32_t in_1;
  float val_1;
  int j_1;
  uint i_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_1;
  string local_120 [39];
  allocator<unsigned_char> local_f9;
  undefined1 local_f8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_check_1;
  string local_d8 [32];
  double local_b8;
  uint64_t in;
  double val;
  uint local_a0;
  int j;
  uint i;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  string local_78 [55];
  allocator<unsigned_char> local_41;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_check;
  int format_local;
  int n_rows_local;
  int n_cols_local;
  double *vf_local;
  string *output_to_file_local;
  
  out_check.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = format;
  if (format == 2) {
    std::allocator<unsigned_char>::allocator(&local_41);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,8,&local_41);
    std::allocator<unsigned_char>::~allocator(&local_41);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    endian::to_little_64(&check::val_8b,puVar1);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_78,(char *)puVar1,8,
               (allocator *)
               ((long)&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::operator+=((string *)output_to_file,local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&j + 3));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,(long)(n_cols << 3),
               (allocator<unsigned_char> *)((long)&j + 3));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&j + 3));
    for (local_a0 = 0; local_a0 < (uint)n_rows; local_a0 = local_a0 + 1) {
      for (val._4_4_ = 0; val._4_4_ < n_cols; val._4_4_ = val._4_4_ + 1) {
        local_b8 = vf[n_cols * local_a0 + val._4_4_];
        in = (uint64_t)local_b8;
        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i,
                            (long)(val._4_4_ << 3));
        endian::to_little_64((uint64_t *)&local_b8,pvVar2);
      }
      puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d8,(char *)puVar1,(long)n_cols << 3,
                 (allocator *)
                 ((long)&out_check_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      std::__cxx11::string::operator+=((string *)output_to_file,local_d8);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&out_check_1.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  }
  else if (format == 1) {
    std::allocator<unsigned_char>::allocator(&local_f9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8,4,&local_f9);
    std::allocator<unsigned_char>::~allocator(&local_f9);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    endian::to_little_32(&check::val_4b,puVar1);
    puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_120,(char *)puVar1,4,
               (allocator *)
               ((long)&out_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::operator+=((string *)output_to_file,local_120);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&out_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&j_1 + 3));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,(long)(n_cols << 2),
               (allocator<unsigned_char> *)((long)&j_1 + 3));
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&j_1 + 3));
    for (val_1 = 0.0; (uint)val_1 < (uint)n_rows; val_1 = (float)((int)val_1 + 1)) {
      for (in_1 = 0; (int)in_1 < n_cols; in_1 = in_1 + 1) {
        local_154 = (float)vf[n_cols * (int)val_1 + in_1];
        local_150 = local_154;
        pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1,
                            (long)(int)(in_1 << 2));
        endian::to_little_32((uint32_t *)&local_154,pvVar2);
      }
      puVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,(char *)puVar1,(long)n_cols << 2,&local_179);
      std::__cxx11::string::operator+=((string *)output_to_file,local_178);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&i_1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
  }
  std::__cxx11::string::operator+=((string *)output_to_file,"\n");
  return;
}

Assistant:

void append_data_bin_to_string( std::string & output_to_file, const T * vf, int n_cols, int n_rows, int format)
    try
    {
        if( format == OVF_FORMAT_BIN8 )
        {
            auto out_check = std::vector<uint8_t>(8);
            endian::to_little_64(check::val_8b, out_check.data());

            output_to_file +=
                std::string( reinterpret_cast<const char *>(out_check.data()), sizeof(double) );

            std::vector<uint8_t> out(n_cols*8);
            for (unsigned int i=0; i<n_rows; ++i)
            {
                for (int j=0; j<n_cols; ++j)
                {
                    double val = static_cast<double>(vf[n_cols*i + j]);
                    uint64_t in = *reinterpret_cast<uint64_t*>(&val);

                    endian::to_little_64(in, &out[j*8]);
                }
                output_to_file +=
                    std::string( reinterpret_cast<char *>(out.data()), n_cols*sizeof(double) );
            }
        }
        else if( format == OVF_FORMAT_BIN4 )
        {
            auto out_check = std::vector<uint8_t>(4);
            endian::to_little_32(check::val_4b, out_check.data());

            output_to_file +=
                std::string( reinterpret_cast<const char *>(out_check.data()), sizeof(float) );

            std::vector<uint8_t> out(n_cols*4);
            for (unsigned int i=0; i<n_rows; ++i)
            {
                for (int j=0; j<n_cols; ++j)
                {
                    float val = static_cast<float>(vf[n_cols*i + j]);
                    uint32_t in = *reinterpret_cast<uint32_t*>(&val);

                    endian::to_little_32(in, &out[j*4]);
                }
                output_to_file +=
                    std::string( reinterpret_cast<char *>(out.data()), n_cols*sizeof(float) );
            }
        }

        output_to_file += "\n";
    }
    catch( ... )
    {

    }